

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O0

void TTD::NSLogEvents::SetPropertyAction_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  bool bVar1;
  BOOL BVar2;
  PropertyId propertyId;
  ScriptContext *scriptContext;
  JsRTVarAndIntegralArgumentsAction_InternalUse<2UL,_2UL> *argAction;
  TTDVar pvVar3;
  RecyclableObject *pRVar4;
  ScriptContext *pSVar5;
  int64 iVar6;
  RecyclableObject *__obj_1;
  Var value;
  RecyclableObject *__obj;
  Var var;
  JsRTDoubleVarDoubleScalarArgumentAction *action;
  ScriptContext *ctx;
  ThreadContextTTD *executeContext_local;
  EventLogEntry *evt_local;
  
  scriptContext = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (scriptContext == (ScriptContext *)0x0) {
    TTDAbort_unrecoverable_error("This should be non-null!!!");
  }
  argAction = GetInlineEventDataAs<TTD::NSLogEvents::JsRTVarAndIntegralArgumentsAction_InternalUse<2ul,2ul>,(TTD::NSLogEvents::EventKind)59>
                        (evt);
  pvVar3 = GetVarItem_0<2ul,2ul>(argAction);
  __obj = (RecyclableObject *)InflateVarInReplay(executeContext,pvVar3);
  if ((__obj != (RecyclableObject *)0x0) &&
     (BVar2 = Js::JavascriptOperators::IsObject(__obj), BVar2 != 0)) {
    pRVar4 = Js::VarTo<Js::RecyclableObject>(__obj);
    pSVar5 = Js::RecyclableObject::GetScriptContext(pRVar4);
    if (pSVar5 != scriptContext) {
      __obj = (RecyclableObject *)Js::CrossSite::MarshalVar(scriptContext,pRVar4,false);
    }
    pvVar3 = GetVarItem_1<2ul,2ul>(argAction);
    __obj_1 = (RecyclableObject *)InflateVarInReplay(executeContext,pvVar3);
    if (__obj_1 != (RecyclableObject *)0x0) {
      bVar1 = Js::VarIs<Js::RecyclableObject>(__obj_1);
      if (bVar1) {
        pRVar4 = Js::VarTo<Js::RecyclableObject>(__obj_1);
        pSVar5 = Js::RecyclableObject::GetScriptContext(pRVar4);
        if (pSVar5 != scriptContext) {
          __obj_1 = (RecyclableObject *)Js::CrossSite::MarshalVar(scriptContext,pRVar4,false);
        }
      }
      propertyId = GetPropertyIdItem<2ul,2ul>(argAction);
      iVar6 = GetScalarItem_1<2ul,2ul>(argAction);
      Js::JavascriptOperators::OP_SetProperty
                (__obj,propertyId,__obj_1,scriptContext,(PropertyValueInfo *)0x0,(uint)(iVar6 != 0),
                 (Var)0x0);
    }
  }
  return;
}

Assistant:

void SetPropertyAction_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTDoubleVarDoubleScalarArgumentAction* action = GetInlineEventDataAs<JsRTDoubleVarDoubleScalarArgumentAction, EventKind::SetPropertyActionTag>(evt);
            Js::Var var = InflateVarInReplay(executeContext, GetVarItem_0(action));
            TTD_REPLAY_VALIDATE_INCOMING_OBJECT(var, ctx);
            Js::Var value = InflateVarInReplay(executeContext, GetVarItem_1(action));
            TTD_REPLAY_VALIDATE_INCOMING_REFERENCE(value, ctx);

            Js::JavascriptOperators::OP_SetProperty(var, GetPropertyIdItem(action), value, ctx, nullptr, GetScalarItem_1(action) ? Js::PropertyOperation_StrictMode : Js::PropertyOperation_None);
        }